

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LockFreeQueue.h
# Opt level: O2

void __thiscall
NotLockFreeQueue<std::packaged_task<void_()>_>::NotLockFreeQueue
          (NotLockFreeQueue<std::packaged_task<void_()>_> *this,size_t max_size_)

{
  std::
  queue<std::packaged_task<void()>,std::deque<std::packaged_task<void()>,std::allocator<std::packaged_task<void()>>>>
  ::queue<std::deque<std::packaged_task<void()>,std::allocator<std::packaged_task<void()>>>,void>
            (&this->queue);
  this->max_size = max_size_;
  (this->mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&this->cond_var_pop);
  std::condition_variable::condition_variable(&this->cond_var_push);
  return;
}

Assistant:

NotLockFreeQueue<T>::NotLockFreeQueue(size_t max_size_) : 
        max_size(max_size_) {}